

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall c4::yml::Tree::first_child(Tree *this,size_t node)

{
  code *pcVar1;
  Location loc;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    eVar3 = get_error_flags();
    if ((eVar3 & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        sVar4 = (*pcVar1)();
        return sVar4;
      }
    }
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc.name.str = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc);
  }
  return this->m_buf[node].m_first_child;
}

Assistant:

size_t first_child(size_t node) const { return _p(node)->m_first_child; }